

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::~GLES2ThreadedSharingTest(GLES2ThreadedSharingTest *this)

{
  ~GLES2ThreadedSharingTest(this);
  operator_delete(this,0x1b10);
  return;
}

Assistant:

GLES2ThreadedSharingTest::~GLES2ThreadedSharingTest (void)
{
	GLES2ThreadedSharingTest::deinit();
}